

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O2

ostream * operator<<(ostream *outs,Index *i)

{
  ostream *poVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pPVar2;
  Iterator map_it;
  Iterator mmap_it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  map_it.tree_iter =
       BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
       ::begin((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)i);
  while (map_it.tree_iter.node_ptr !=
         (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x0) {
    Map::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::Iterator::key(&local_68,&map_it);
    poVar1 = std::operator<<(outs,(string *)&local_68);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_68);
    pPVar2 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::Iterator::operator->(&map_it.tree_iter);
    mmap_it.tree_iter =
         BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
         ::begin(&(pPVar2->value).tree);
    while (mmap_it.tree_iter.node_ptr !=
           (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
            *)0x0) {
      std::operator<<(outs,'\t');
      MultiMap::
      MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
      ::Iterator::key(&local_68,&mmap_it);
      poVar1 = std::operator<<(outs,(string *)&local_68);
      poVar1 = std::operator<<(poVar1,": ");
      MultiMap::
      MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
      ::Iterator::operator*((vector<long,_std::allocator<long>_> *)&local_48,&mmap_it);
      poVar1 = operator<<(poVar1,(vector<long,_std::allocator<long>_> *)&local_48);
      std::operator<<(poVar1,'\n');
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      MultiMap::
      MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
      ::Iterator::operator++(&mmap_it);
    }
    Map::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::Iterator::operator++(&map_it);
  }
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, const Index& i) {
    for (auto map_it = i.index.begin(); map_it != nullptr; ++map_it) {
        outs << map_it.key() << '\n';
        for (auto mmap_it = map_it->begin(); mmap_it != nullptr; ++mmap_it) {
            outs << '\t';
            outs << mmap_it.key() << ": " << *mmap_it << '\n';
        }
    }
    return outs;
}